

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim.c
# Opt level: O0

double SSIMGetClipped_C(uint8_t *src1,int stride1,uint8_t *src2,int stride2,int xo,int yo,int W,
                       int H)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar4;
  int in_stack_00000008;
  int in_stack_00000010;
  uint32_t s2;
  uint32_t s1;
  uint32_t w;
  int y;
  int x;
  int xmax;
  int xmin;
  int ymax;
  int ymin;
  VP8DistoStats stats;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_54;
  int local_50;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  long local_18;
  int local_c;
  long local_8;
  
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(&local_3c,0,0x18);
  if (local_24 + -3 < 0) {
    local_64 = 0;
  }
  else {
    local_64 = local_24 + -3;
  }
  if (in_stack_00000010 + -1 < local_24 + 3) {
    local_68 = in_stack_00000010 + -1;
  }
  else {
    local_68 = local_24 + 3;
  }
  if (local_20 + -3 < 0) {
    local_6c = 0;
  }
  else {
    local_6c = local_20 + -3;
  }
  if (in_stack_00000008 + -1 < local_20 + 3) {
    local_70 = in_stack_00000008 + -1;
  }
  else {
    local_70 = local_20 + 3;
  }
  local_8 = local_8 + local_64 * local_c;
  local_18 = local_18 + local_64 * local_1c;
  for (local_54 = local_64; local_54 <= local_68; local_54 = local_54 + 1) {
    for (local_50 = local_6c; local_50 <= local_70; local_50 = local_50 + 1) {
      iVar1 = kWeight[(local_50 + 3) - local_20] * kWeight[(local_54 + 3) - local_24];
      uVar2 = (uint)*(byte *)(local_8 + local_50);
      uVar3 = (uint)*(byte *)(local_18 + local_50);
      local_3c = iVar1 + local_3c;
      local_38 = iVar1 * uVar2 + local_38;
      local_34 = iVar1 * uVar3 + local_34;
      local_30 = iVar1 * uVar2 * uVar2 + local_30;
      local_2c = iVar1 * uVar2 * uVar3 + local_2c;
      local_28 = iVar1 * uVar3 * uVar3 + local_28;
    }
    local_8 = local_8 + local_c;
    local_18 = local_18 + local_1c;
  }
  dVar4 = VP8SSIMFromStatsClipped((VP8DistoStats *)0x19aaf8);
  return dVar4;
}

Assistant:

static double SSIMGetClipped_C(const uint8_t* src1, int stride1,
                               const uint8_t* src2, int stride2,
                               int xo, int yo, int W, int H) {
  VP8DistoStats stats = { 0, 0, 0, 0, 0, 0 };
  const int ymin = (yo - VP8_SSIM_KERNEL < 0) ? 0 : yo - VP8_SSIM_KERNEL;
  const int ymax = (yo + VP8_SSIM_KERNEL > H - 1) ? H - 1
                                                  : yo + VP8_SSIM_KERNEL;
  const int xmin = (xo - VP8_SSIM_KERNEL < 0) ? 0 : xo - VP8_SSIM_KERNEL;
  const int xmax = (xo + VP8_SSIM_KERNEL > W - 1) ? W - 1
                                                  : xo + VP8_SSIM_KERNEL;
  int x, y;
  src1 += ymin * stride1;
  src2 += ymin * stride2;
  for (y = ymin; y <= ymax; ++y, src1 += stride1, src2 += stride2) {
    for (x = xmin; x <= xmax; ++x) {
      const uint32_t w = kWeight[VP8_SSIM_KERNEL + x - xo]
                       * kWeight[VP8_SSIM_KERNEL + y - yo];
      const uint32_t s1 = src1[x];
      const uint32_t s2 = src2[x];
      stats.w   += w;
      stats.xm  += w * s1;
      stats.ym  += w * s2;
      stats.xxm += w * s1 * s1;
      stats.xym += w * s1 * s2;
      stats.yym += w * s2 * s2;
    }
  }
  return VP8SSIMFromStatsClipped(&stats);
}